

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

void __thiscall clipp::detail::scoped_dfs_traverser::check_if_left_scope(scoped_dfs_traverser *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  long in_RDI;
  memento *in_stack_00000018;
  uint in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  bVar1 = group::depth_first_traverser::operator_cast_to_bool((depth_first_traverser *)0x19c6cc);
  if (bVar1) {
    in_stack_ffffffffffffffec =
         group::depth_first_traverser::level((depth_first_traverser *)0x19c6df);
    iVar3 = group::depth_first_traverser::level((depth_first_traverser *)0x19c6f1);
    if (in_stack_ffffffffffffffec < iVar3) {
      while( true ) {
        bVar1 = std::
                stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                ::empty((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                         *)0x19c70f);
        in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 & 0xffffff;
        if (!bVar1) {
          pvVar5 = std::
                   stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                   ::top((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                          *)0x19c72a);
          iVar3 = group::depth_first_traverser::memento::level(pvVar5);
          iVar4 = group::depth_first_traverser::level((depth_first_traverser *)0x19c740);
          in_stack_ffffffffffffffe8 = CONCAT13(iVar4 <= iVar3,(int3)in_stack_ffffffffffffffe8);
        }
        if ((char)(in_stack_ffffffffffffffe8 >> 0x18) == '\0') break;
        std::
        stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
        ::top((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
               *)0x19c767);
        group::depth_first_traverser::undo(&this->pos_,in_stack_00000018);
        std::
        stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
        ::pop((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
               *)0x19c782);
      }
      group::depth_first_traverser::invalidate((depth_first_traverser *)0x19c795);
    }
  }
  while( true ) {
    bVar2 = std::
            stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
            ::empty((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                     *)0x19c7a7);
    bVar1 = false;
    if (!bVar2) {
      pvVar5 = std::
               stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
               ::top((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
                      *)0x19c7c2);
      iVar3 = group::depth_first_traverser::memento::level(pvVar5);
      iVar4 = group::depth_first_traverser::level((depth_first_traverser *)0x19c7d8);
      bVar1 = iVar4 < iVar3;
    }
    if (!bVar1) break;
    std::
    stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
    ::top((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
           *)0x19c7ff);
    group::depth_first_traverser::undo(&this->pos_,in_stack_00000018);
    std::
    stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
    ::pop((stack<clipp::group::depth_first_traverser::memento,_std::deque<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>_>
           *)0x19c81a);
  }
  bVar1 = repeat_group_continues
                    ((scoped_dfs_traverser *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  *(bool *)(in_RDI + 0x9a) = bVar1;
  return;
}

Assistant:

void check_if_left_scope()
    {
        if(posAfterLastMatch_) {
            if(pos_.level() < posAfterLastMatch_.level()) {
                while(!scopes_.empty() && scopes_.top().level() >= pos_.level()) {
                    pos_.undo(scopes_.top());
                    scopes_.pop();
                }
                posAfterLastMatch_.invalidate();
            }
        }
        while(!scopes_.empty() && scopes_.top().level() > pos_.level()) {
            pos_.undo(scopes_.top());
            scopes_.pop();
        }
        repeatGroupContinues_ = repeat_group_continues();
    }